

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Datetime.cpp
# Opt level: O2

void __thiscall Datetime::operator++(Datetime *this,int param_1)

{
  int y;
  int m;
  int d;
  int hr;
  int mi;
  int se;
  Datetime tomorrow;
  Datetime local_c8;
  Datetime local_98;
  Datetime local_60;
  
  startOfDay(&local_60,this);
  local_c8._date = local_60._date + 0x15f91;
  local_c8._year = 0;
  local_c8._month = 0;
  local_c8._8_8_ = (ulong)(uint)weekstart << 0x20;
  local_c8._julian = 0;
  local_c8._day = 0;
  local_c8._seconds = 0;
  local_c8._offset = 0;
  local_c8._utc = false;
  startOfDay(&local_98,&local_c8);
  y = year(&local_98);
  m = month(&local_98);
  d = day(&local_98);
  hr = hour(this);
  mi = minute(this);
  se = second(this);
  Datetime(&local_c8,y,m,d,hr,mi,se);
  this->_date = local_c8._date;
  return;
}

Assistant:

void Datetime::operator++ (int)
{
  Datetime tomorrow = (startOfDay () + 90001).startOfDay ();
  tomorrow = Datetime (tomorrow.year (),
                       tomorrow.month (),
                       tomorrow.day (),
                       hour (),
                       minute (),
                       second ());
  _date = tomorrow._date;
}